

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaAigerExt.c
# Opt level: O0

Vec_Str_t * Gia_AigerWriteMappingSimple(Gia_Man_t *p)

{
  int iVar1;
  int iVar2;
  char *pArray;
  int *__src;
  Vec_Str_t *pVVar3;
  uchar *pBuffer;
  Gia_Man_t *p_local;
  
  iVar1 = Vec_IntSize(p->vMapping);
  pArray = (char *)malloc((long)(iVar1 << 2));
  __src = Vec_IntArray(p->vMapping);
  iVar1 = Vec_IntSize(p->vMapping);
  memcpy(pArray,__src,(long)iVar1 << 2);
  iVar1 = Vec_IntSize(p->vMapping);
  iVar2 = Gia_ManObjNum(p);
  if (iVar2 <= iVar1) {
    iVar1 = Vec_IntSize(p->vMapping);
    pVVar3 = Vec_StrAllocArray(pArray,iVar1 << 2);
    return pVVar3;
  }
  __assert_fail("Vec_IntSize(p->vMapping) >= Gia_ManObjNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaAigerExt.c"
                ,0xe6,"Vec_Str_t *Gia_AigerWriteMappingSimple(Gia_Man_t *)");
}

Assistant:

Vec_Str_t * Gia_AigerWriteMappingSimple( Gia_Man_t * p )
{
    unsigned char * pBuffer = ABC_ALLOC( unsigned char, 4*Vec_IntSize(p->vMapping) );
    memcpy( pBuffer, Vec_IntArray(p->vMapping), (size_t)4*Vec_IntSize(p->vMapping) );
    assert( Vec_IntSize(p->vMapping) >= Gia_ManObjNum(p) );
    return Vec_StrAllocArray( (char *)pBuffer, 4*Vec_IntSize(p->vMapping) );
}